

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O0

bool __thiscall IntView<3>::indomain(IntView<3> *this,int64_t v)

{
  long in_RSI;
  long in_RDI;
  IntVar *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  if (in_RSI % (long)*(int *)(in_RDI + 8) == 0) {
    bVar1 = IntVar::indomain(unaff_retaddr,
                             CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool indomain(int64_t v) const {
		if ((type & 4) != 0) {
			v -= b;
		}
		if ((type & 2) != 0) {
			if ((v % a) != 0) {
				return false;
			}
			v = v / a;
		}
		if ((type & 1) != 0) {
			v = -v;
		}
		return var->indomain(v);
	}